

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnRefIsNullExpr(TypeChecker *this)

{
  Result RVar1;
  Result RVar2;
  long *plVar3;
  char *in_RCX;
  long *plVar4;
  Type type;
  TypeVector actual;
  string message;
  Type local_7c;
  void *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  RVar1 = PeekType(this,0,&local_7c);
  if ((8 < (uint)(local_7c.enum_ + ~(Func|I32U))) ||
     (in_RCX = (char *)0x181, (0x181U >> (local_7c.enum_ + ~(Func|I32U) & 0x1fU) & 1) == 0)) {
    local_78 = (void *)0x0;
    uStack_70 = 0;
    local_68 = 0;
    if (RVar1.enum_ == Ok) {
      std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_realloc_insert<wabt::Type_const&>
                ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_78,(iterator)0x0,&local_7c)
      ;
    }
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_38,(_anonymous_namespace_ *)&local_78,(TypeVector *)0x0,in_RCX);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x1e2264);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_48 = *plVar4;
      lStack_40 = plVar3[3];
      local_58 = &local_48;
    }
    else {
      local_48 = *plVar4;
      local_58 = (long *)*plVar3;
    }
    local_50 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    PrintError(this,"%s",local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
    if (local_78 != (void *)0x0) {
      operator_delete(local_78);
    }
    RVar1.enum_ = Error;
  }
  RVar2 = DropTypes(this,1);
  PushType(this,(Type)0xffffffff);
  return (Result)(uint)(RVar2.enum_ == Error || RVar1.enum_ == Error);
}

Assistant:

Result TypeChecker::OnRefIsNullExpr() {
  Type type;
  Result result = PeekType(0, &type);
  if (!type.IsRef()) {
    TypeVector actual;
    if (Succeeded(result)) {
      actual.push_back(type);
    }
    std::string message =
        "type mismatch in ref.is_null, expected reference but got " +
        TypesToString(actual);
    PrintError("%s", message.c_str());
    result = Result::Error;
  }
  result |= DropTypes(1);
  PushType(Type::I32);
  return result;
}